

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

BxDFFlags __thiscall
pbrt::TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
          (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this)

{
  float fVar1;
  DielectricInterfaceBxDF *pDVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  
  pDVar2 = this->top;
  if (pDVar2 != (DielectricInterfaceBxDF *)0x0) {
    auVar3 = vminss_avx(ZEXT416((uint)(pDVar2->mfDistrib).alpha_y),
                        ZEXT416((uint)(pDVar2->mfDistrib).alpha_x));
    return (uint)(auVar3._0_4_ < 0.001) * 8 + (GlossyTransmission|Reflection);
  }
  fVar1 = (this->bottom->R).values.values[0];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    return DiffuseReflection;
  }
  uVar4 = 0xffffffffffffffff;
  while (uVar4 != 2) {
    fVar1 = (this->bottom->R).values.values[uVar4 + 2];
    uVar4 = uVar4 + 1;
    if ((fVar1 != 0.0) || (NAN(fVar1))) goto LAB_0041e880;
  }
  uVar4 = 3;
LAB_0041e880:
  return (uint)(uVar4 < 3) * 5;
}

Assistant:

PBRT_CPU_GPU
    BxDFFlags Flags() const { return top ? top->Flags() : bottom->Flags(); }